

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

bool google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault::IsInitializedImpl
               (MessageLite *msg)

{
  bool bVar1;
  uint32_t *puVar2;
  FeatureSetDefaults_FeatureSetEditionDefault *this_;
  MessageLite *msg_local;
  
  puVar2 = internal::HasBits<1>::operator[]((HasBits<1> *)(msg + 1),0);
  if (((*puVar2 & 1) == 0) ||
     (bVar1 = FeatureSet::IsInitialized((FeatureSet *)msg[1]._internal_metadata_.ptr_), bVar1)) {
    puVar2 = internal::HasBits<1>::operator[]((HasBits<1> *)(msg + 1),0);
    if (((*puVar2 & 2) == 0) ||
       (bVar1 = FeatureSet::IsInitialized((FeatureSet *)msg[2]._vptr_MessageLite), bVar1)) {
      msg_local._7_1_ = true;
    }
    else {
      msg_local._7_1_ = false;
    }
  }
  else {
    msg_local._7_1_ = false;
  }
  return msg_local._7_1_;
}

Assistant:

PROTOBUF_NOINLINE bool FeatureSetDefaults_FeatureSetEditionDefault::IsInitializedImpl(
    const MessageLite& msg) {
  auto& this_ = static_cast<const FeatureSetDefaults_FeatureSetEditionDefault&>(msg);
  if ((this_._impl_._has_bits_[0] & 0x00000001u) != 0) {
    if (!this_._impl_.overridable_features_->IsInitialized()) return false;
  }
  if ((this_._impl_._has_bits_[0] & 0x00000002u) != 0) {
    if (!this_._impl_.fixed_features_->IsInitialized()) return false;
  }
  return true;
}